

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void resizestack(lua_State *L,MSize n)

{
  uint64_t uVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  undefined8 *local_40;
  GCobj *up;
  MSize realsize;
  MSize oldsize;
  ptrdiff_t delta;
  TValue *oldst;
  TValue *st;
  MSize n_local;
  lua_State *L_local;
  
  uVar1 = (L->stack).ptr64;
  up._4_4_ = L->stacksize;
  uVar2 = n + 9;
  pvVar3 = lj_mem_realloc(L,(void *)(L->stack).ptr64,(ulong)(up._4_4_ << 3),(ulong)(uVar2 * 8));
  (L->stack).ptr64 = (uint64_t)pvVar3;
  lVar4 = (long)pvVar3 - uVar1;
  (L->maxstack).ptr64 = (uint64_t)((long)pvVar3 + (ulong)n * 8);
  while (up._4_4_ < uVar2) {
    *(undefined8 *)((long)pvVar3 + (ulong)up._4_4_ * 8) = 0xffffffffffffffff;
    up._4_4_ = up._4_4_ + 1;
  }
  L->stacksize = uVar2;
  if (*(long *)((L->glref).ptr64 + 0x178) - uVar1 < (ulong)up._4_4_) {
    *(long *)((L->glref).ptr64 + 0x178) = *(long *)((L->glref).ptr64 + 0x178) + lVar4;
  }
  L->base = (TValue *)((long)L->base + lVar4);
  L->top = (TValue *)((long)L->top + lVar4);
  for (local_40 = (undefined8 *)(L->openupval).gcptr64; local_40 != (undefined8 *)0x0;
      local_40 = (undefined8 *)*local_40) {
    local_40[4] = local_40[4] + lVar4;
  }
  return;
}

Assistant:

static void resizestack(lua_State *L, MSize n)
{
  TValue *st, *oldst = tvref(L->stack);
  ptrdiff_t delta;
  MSize oldsize = L->stacksize;
  MSize realsize = n + 1 + LJ_STACK_EXTRA;
  GCobj *up;
  lj_assertL((MSize)(tvref(L->maxstack)-oldst) == L->stacksize-LJ_STACK_EXTRA-1,
	     "inconsistent stack size");
  st = (TValue *)lj_mem_realloc(L, tvref(L->stack),
				(MSize)(oldsize*sizeof(TValue)),
				(MSize)(realsize*sizeof(TValue)));
  setmref(L->stack, st);
  delta = (char *)st - (char *)oldst;
  setmref(L->maxstack, st + n);
  while (oldsize < realsize)  /* Clear new slots. */
    setnilV(st + oldsize++);
  L->stacksize = realsize;
  if ((size_t)(mref(G(L)->jit_base, char) - (char *)oldst) < oldsize)
    setmref(G(L)->jit_base, mref(G(L)->jit_base, char) + delta);
  L->base = (TValue *)((char *)L->base + delta);
  L->top = (TValue *)((char *)L->top + delta);
  for (up = gcref(L->openupval); up != NULL; up = gcnext(up))
    setmref(gco2uv(up)->v, (TValue *)((char *)uvval(gco2uv(up)) + delta));
}